

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse_optimizer.cpp
# Opt level: O1

void __thiscall
duckdb::CommonSubExpressionOptimizer::ExtractCommonSubExpresions
          (CommonSubExpressionOptimizer *this,LogicalOperator *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var2;
  __node_base _Var3;
  LogicalProjection *this_00;
  reference pvVar4;
  pointer pLVar5;
  pointer pLVar6;
  bool bVar7;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_01;
  templated_unique_single_t projection;
  CSEReplacementState state;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  idx_t local_c8;
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  CommonSubExpressionOptimizer *local_50;
  idx_t *piStack_48;
  code *local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined1 local_20;
  
  local_c0._M_buckets = &local_c0._M_single_bucket;
  local_c0._M_bucket_count = 1;
  local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c0._M_element_count = 0;
  local_c0._M_rehash_policy._M_max_load_factor = 1.0;
  local_c0._M_rehash_policy._M_next_resize = 0;
  local_c0._M_single_bucket = (__node_base_ptr)0x0;
  local_88._M_buckets = &local_88._M_single_bucket;
  local_88._M_bucket_count = 1;
  local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_88._M_element_count = 0;
  local_88._M_rehash_policy._M_max_load_factor = 1.0;
  local_88._M_rehash_policy._M_next_resize = 0;
  local_88._M_single_bucket = (__node_base_ptr)0x0;
  local_50 = (CommonSubExpressionOptimizer *)0x0;
  piStack_48 = (idx_t *)0x0;
  local_40 = (code *)0x0;
  uStack_38 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_20 = 0;
  pcStack_d0 = ::std::
               _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:147:10)>
               ::_M_invoke;
  local_d8 = ::std::
             _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:147:10)>
             ::_M_manager;
  local_e8._M_unused._M_object = this;
  local_e8._8_8_ = &local_c8;
  LogicalOperatorVisitor::EnumerateExpressions
            (op,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*)>
                 *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,3);
  }
  if (local_c0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    bVar7 = false;
    _Var3._M_nxt = local_c0._M_before_begin._M_nxt;
    do {
      if ((_Hash_node_base *)&DAT_00000001 < _Var3._M_nxt[2]._M_nxt) {
        bVar7 = true;
        break;
      }
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt;
    } while (_Var3._M_nxt != (_Hash_node_base *)0x0);
    if (bVar7) {
      local_c8 = Binder::GenerateTableIndex(this->binder);
      pcStack_d0 = ::std::
                   _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:165:10)>
                   ::_M_invoke;
      local_d8 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/cse_optimizer.cpp:165:10)>
                 ::_M_manager;
      local_e8._M_unused._M_object = this;
      local_e8._8_8_ = &local_c8;
      LogicalOperatorVisitor::EnumerateExpressions
                (op,(function<void_(duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*)>
                     *)&local_e8);
      if (local_d8 != (code *)0x0) {
        (*local_d8)(&local_e8,&local_e8,3);
      }
      this_00 = (LogicalProjection *)operator_new(0x70);
      local_e8._M_unused._M_object = local_50;
      local_e8._8_8_ = piStack_48;
      local_d8 = local_40;
      local_50 = (CommonSubExpressionOptimizer *)0x0;
      piStack_48 = (idx_t *)0x0;
      local_40 = (code *)0x0;
      LogicalProjection::LogicalProjection
                (this_00,local_c8,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_e8);
      local_f0._M_head_impl = this_00;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_e8._M_pod_data);
      this_01 = &op->children;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](this_01,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      if (pLVar5->has_estimated_cardinality == true) {
        pLVar6 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                 ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                               *)&local_f0);
        pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::operator[](this_01,0);
        pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(pvVar4);
        LogicalOperator::SetEstimatedCardinality
                  (&pLVar6->super_LogicalOperator,pLVar5->estimated_cardinality);
      }
      pLVar6 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
               ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                             *)&local_f0);
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](this_01,0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar6->super_LogicalOperator).children,pvVar4);
      _Var2._M_head_impl = local_f0._M_head_impl;
      local_f0._M_head_impl = (LogicalProjection *)0x0;
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](this_01,0);
      _Var1._M_head_impl =
           (pvVar4->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar4->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           &(_Var2._M_head_impl)->super_LogicalOperator;
      if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if (local_f0._M_head_impl != (LogicalProjection *)0x0) {
        (*((local_f0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
    }
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&uStack_38);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_50);
  ::std::
  _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::CSENode>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c0);
  return;
}

Assistant:

void CommonSubExpressionOptimizer::ExtractCommonSubExpresions(LogicalOperator &op) {
	D_ASSERT(op.children.size() == 1);

	// first we count for each expression with children how many types it occurs
	CSEReplacementState state;
	LogicalOperatorVisitor::EnumerateExpressions(
	    op, [&](unique_ptr<Expression> *child) { CountExpressions(**child, state); });
	// check if there are any expressions to extract
	bool perform_replacement = false;
	for (auto &expr : state.expression_count) {
		if (expr.second.count > 1) {
			perform_replacement = true;
			break;
		}
	}
	if (!perform_replacement) {
		// no CSEs to extract
		return;
	}
	state.projection_index = binder.GenerateTableIndex();
	// we found common subexpressions to extract
	// now we iterate over all the expressions and perform the actual CSE elimination

	LogicalOperatorVisitor::EnumerateExpressions(
	    op, [&](unique_ptr<Expression> *child) { PerformCSEReplacement(*child, state); });
	D_ASSERT(state.expressions.size() > 0);
	// create a projection node as the child of this node
	auto projection = make_uniq<LogicalProjection>(state.projection_index, std::move(state.expressions));
	if (op.children[0]->has_estimated_cardinality) {
		projection->SetEstimatedCardinality(op.children[0]->estimated_cardinality);
	}
	projection->children.push_back(std::move(op.children[0]));
	op.children[0] = std::move(projection);
}